

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeText.ICU.cpp
# Opt level: O0

CharacterClassificationType
PlatformAgnostic::UnicodeText::GetLegacyCharacterClassificationType(char16 character)

{
  byte bVar1;
  uint uVar2;
  uint32_t charTypeMask;
  char16 character_local;
  
  bVar1 = u_charType_70(character);
  uVar2 = 1 << (bVar1 & 0x1f);
  if ((uVar2 & 0x3e) == 0) {
    if ((uVar2 & 0x30f80200) == 0) {
      if ((((uVar2 & 0x1000) == 0) && (character != L'\xfeff')) && (character != L'\xfffe')) {
        charTypeMask = 0;
      }
      else {
        charTypeMask = 2;
      }
    }
    else {
      charTypeMask = 4;
    }
  }
  else {
    charTypeMask = 1;
  }
  return charTypeMask;
}

Assistant:

CharacterClassificationType GetLegacyCharacterClassificationType(char16 character)
        {
            auto charTypeMask = U_GET_GC_MASK(character);

            if ((charTypeMask & U_GC_L_MASK) != 0)
            {
                return CharacterClassificationType::Letter;
            }

            if ((charTypeMask & (U_GC_ND_MASK | U_GC_P_MASK)) != 0)
            {
                return CharacterClassificationType::DigitOrPunct;
            }

            // As per http://archives.miloush.net/michkap/archive/2007/06/11/3230072.html
            //  * C1_SPACE corresponds to the Unicode Zs category.
            //  * C1_BLANK corresponds to a hardcoded list thats ill-defined.
            // We'll skip that compatibility here and just check for Zs.
            // We explicitly check for 0xFEFF to satisfy the unit test in es5/Lex_u3.js
            if ((charTypeMask & U_GC_ZS_MASK) != 0 ||
                character == 0xFEFF ||
                character == 0xFFFE)
            {
                return CharacterClassificationType::Whitespace;
            }

            return CharacterClassificationType::Invalid;
        }